

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_from_range(uint64_t min,uint64_t max,uint64_t step)

{
  uint8_t typecode;
  uint size;
  array_container_t *arr;
  leaf_t *val;
  uint min_00;
  uint32_t max_00;
  ulong uVar1;
  uint8_t high48 [6];
  uint8_t local_4d;
  uint local_4c;
  roaring64_bitmap_t *local_48;
  uint local_40;
  ushort local_3c;
  long local_38;
  
  if (min < max && step != 0) {
    local_48 = roaring64_bitmap_create();
    if (step < 0x10000) {
      local_38 = step - 1;
      local_4c = (uint)step & 0xffff;
      do {
        uVar1 = max - (min & 0xffffffffffff0000);
        if (0xffff < uVar1) {
          uVar1 = 0x10000;
        }
        min_00 = (uint)min & 0xffff;
        max_00 = (uint32_t)uVar1;
        if (step == 1) {
          arr = (array_container_t *)container_range_of_ones(min_00,max_00,&local_4d);
          typecode = local_4d;
        }
        else {
          size = (uint)((ulong)(~min_00 + (uint)step + max_00) / (step & 0xffffffff));
          if (size < 0x1001) {
            arr = array_container_create_given_capacity(size);
            array_container_add_from_range(arr,min_00,max_00,(uint16_t)local_4c);
            typecode = '\x02';
          }
          else {
            arr = (array_container_t *)bitset_container_create();
            bitset_container_add_from_range
                      ((bitset_container_t *)arr,min_00,max_00,(uint16_t)local_4c);
            typecode = '\x01';
          }
        }
        local_40 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
                   (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
        local_3c = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
        val = create_leaf(arr,typecode);
        art_insert(&local_48->art,(art_key_chunk_t *)&local_40,&val->_pad);
        uVar1 = (ulong)(max_00 - min_00) + local_38;
        uVar1 = uVar1 - uVar1 % step;
      } while ((min <= ~uVar1) && (min = min + uVar1, min < max));
    }
    else {
      do {
        if (max <= min) {
          return local_48;
        }
        roaring64_bitmap_add(local_48,min);
        min = min + step;
      } while (min - step <= ~step);
    }
  }
  else {
    local_48 = (roaring64_bitmap_t *)0x0;
  }
  return local_48;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_from_range(uint64_t min, uint64_t max,
                                                uint64_t step) {
    if (step == 0 || max <= min) {
        return NULL;
    }
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    if (step >= (1 << 16)) {
        // Only one value per container.
        for (uint64_t value = min; value < max; value += step) {
            roaring64_bitmap_add(r, value);
            if (value > UINT64_MAX - step) {
                break;
            }
        }
        return r;
    }
    do {
        uint64_t high_bits = min & 0xFFFFFFFFFFFF0000;
        uint16_t container_min = min & 0xFFFF;
        uint32_t container_max = (uint32_t)minimum(max - high_bits, 1 << 16);

        uint8_t typecode;
        container_t *container = container_from_range(
            &typecode, container_min, container_max, (uint16_t)step);

        uint8_t high48[ART_KEY_BYTES];
        split_key(min, high48);
        leaf_t *leaf = create_leaf(container, typecode);
        art_insert(&r->art, high48, (art_val_t *)leaf);

        uint64_t gap = container_max - container_min + step - 1;
        uint64_t increment = gap - (gap % step);
        if (min > UINT64_MAX - increment) {
            break;
        }
        min += increment;
    } while (min < max);
    return r;
}